

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall Game::Run(Game *this,Renderer *renderer,size_t target_frame_duration)

{
  int iVar1;
  int fps;
  bool running;
  thread player2Input;
  thread player1Input;
  bool local_12d;
  int local_12c;
  int local_128;
  int local_124;
  size_t local_120;
  Renderer *local_118;
  reference_wrapper<Snake> local_110;
  reference_wrapper<bool> local_108;
  code *local_100;
  undefined8 local_f8;
  SDL_Point *local_f0;
  reference_wrapper<Snake> local_e8;
  thread local_e0;
  Controller local_d8;
  Controller local_c8;
  Snake local_b0;
  Snake local_70;
  
  local_120 = target_frame_duration;
  local_118 = renderer;
  local_12c = SDL_GetTicks();
  local_12d = true;
  local_c8._Up = 0x40000052;
  local_c8._Down = 0x40000051;
  local_c8._Right = 0x4000004f;
  local_c8._Left = 0x40000050;
  local_d8._Up = 0x77;
  local_d8._Down = 0x73;
  local_d8._Right = 100;
  local_d8._Left = 0x61;
  local_f0 = &this->food;
  fps = 0;
  while ((local_12d & 1U) != 0) {
    local_124 = fps;
    local_128 = SDL_GetTicks();
    local_100 = Controller::HandleInput;
    local_f8 = 0;
    local_110._M_data = &this->snake;
    local_108._M_data = &local_12d;
    std::thread::
    thread<void(Controller::*)(bool&,Snake&)const,Controller&,std::reference_wrapper<bool>,std::reference_wrapper<Snake>,void>
              (&local_e0,(type *)&local_100,&local_c8,&local_108,&local_110);
    local_100 = Controller::HandleInput;
    local_f8 = 0;
    local_110._M_data = (Snake *)&local_12d;
    local_e8._M_data = &this->snake2;
    std::thread::
    thread<void(Controller::*)(bool&,Snake&)const,Controller&,std::reference_wrapper<bool>,std::reference_wrapper<Snake>,void>
              ((thread *)&local_108,(type *)&local_100,&local_d8,
               (reference_wrapper<bool> *)&local_110,&local_e8);
    std::thread::join();
    std::thread::join();
    Update(this);
    Snake::Snake(&local_b0,&this->snake);
    Snake::Snake(&local_70,&this->snake2);
    Renderer::Render(local_118,&local_b0,&local_70,local_f0);
    std::_Vector_base<SDL_Point,_std::allocator<SDL_Point>_>::~_Vector_base
              (&local_70.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>);
    std::_Vector_base<SDL_Point,_std::allocator<SDL_Point>_>::~_Vector_base
              (&local_b0.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>);
    iVar1 = SDL_GetTicks();
    fps = local_124 + 1;
    if (999 < (uint)(iVar1 - local_12c)) {
      Renderer::UpdateWindowTitle(local_118,this->score,fps);
      fps = 0;
      local_12c = iVar1;
    }
    if ((uint)(iVar1 - local_128) < local_120) {
      SDL_Delay((int)local_120 - (iVar1 - local_128));
    }
    std::thread::~thread((thread *)&local_108);
    std::thread::~thread(&local_e0);
  }
  return;
}

Assistant:

void Game::Run(Renderer &renderer, std::size_t target_frame_duration) { 
	Uint32 title_timestamp = SDL_GetTicks();
    Uint32 frame_start;
    Uint32 frame_end;
    Uint32 frame_duration;
    int frame_count = 0;
    bool running = true;
  	
  	Controller player_1_controller(SDLK_UP, SDLK_DOWN, SDLK_RIGHT, SDLK_LEFT);
  	Controller player_2_controller(SDLK_w, SDLK_s, SDLK_d, SDLK_a);
  	
    while (running) {
      frame_start = SDL_GetTicks();

    // Input, Update, Render - the main game loop.
    std::thread player1Input(&Controller::HandleInput, player_1_controller, std::ref(running), std::ref(snake));
    std::thread player2Input(&Controller::HandleInput, player_2_controller, std::ref(running), std::ref(snake2));
    player1Input.join();
    player2Input.join();
    
    Update();
    renderer.Render(snake, snake2, food);


      frame_end = SDL_GetTicks();

      // Keep track of how long each loop through the input/update/render cycle
      // takes.
      frame_count++;
      frame_duration = frame_end - frame_start;

      // After every second, update the window title.
      if (frame_end - title_timestamp >= 1000) {
        renderer.UpdateWindowTitle(score, frame_count);
        frame_count = 0;
        title_timestamp = frame_end;
      }

      // If the time for this frame is too small (i.e. frame_duration is
      // smaller than the target ms_per_frame), delay the loop to
      // achieve the correct frame rate.
      if (frame_duration < target_frame_duration) {
        SDL_Delay(target_frame_duration - frame_duration);
      }
  	}  
}